

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_UInt16 FT_Stream_GetUShort(FT_Stream stream)

{
  uchar *puVar1;
  FT_UInt16 local_1a;
  uchar *puStack_18;
  FT_UInt16 result;
  FT_Byte *p;
  FT_Stream stream_local;
  
  local_1a = 0;
  puVar1 = stream->cursor;
  puStack_18 = puVar1;
  if (puVar1 + 1 < stream->limit) {
    puStack_18 = puVar1 + 2;
    local_1a = CONCAT11(*puVar1,puVar1[1]);
  }
  stream->cursor = puStack_18;
  return local_1a;
}

Assistant:

FT_BASE_DEF( FT_UInt16 )
  FT_Stream_GetUShort( FT_Stream  stream )
  {
    FT_Byte*   p;
    FT_UInt16  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 1 < stream->limit )
      result       = FT_NEXT_USHORT( p );
    stream->cursor = p;

    return result;
  }